

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O1

UTF_RET UTF_uj16_to_uj8(UTF_UC16 *uj16,size_t uj16size,UTF_UC8 *uj8,size_t uj8size)

{
  UTF_UC16 *pUVar1;
  UTF_UC16 UVar2;
  byte bVar3;
  uint uVar4;
  UTF_RET UVar5;
  UTF_UC8 *pUVar6;
  UTF_UC8 *pUVar7;
  UTF_UC16 UVar8;
  ushort uVar9;
  uint in_R8D;
  byte in_R9B;
  byte in_R10B;
  byte in_R11B;
  bool bVar10;
  
  if (uj16size != 0) {
    pUVar1 = uj16 + uj16size;
    pUVar6 = uj8 + (uj8size - 1);
    pUVar7 = uj8;
    do {
      UVar2 = *uj16;
      uVar4 = (uint)(ushort)UVar2;
      uVar9 = UVar2 & 0xfc00;
      if (uVar9 == 0xd800) {
        uj16 = uj16 + 1;
        if (uj16 != pUVar1) {
          UVar8 = *uj16;
          goto LAB_00101c5e;
        }
        if (pUVar7 == pUVar6) {
LAB_00101db8:
          UVar5 = UTF_INSUFFICIENT_BUFFER;
          uj8 = pUVar7;
          goto LAB_00101dbb;
        }
        *pUVar7 = '?';
        uj8 = pUVar7 + 1;
        break;
      }
      UVar8 = L'\0';
LAB_00101c5e:
      if (uVar9 == 0xdc00) {
LAB_00101c8f:
        bVar10 = UVar8 == L'\0';
      }
      else {
        if (uVar9 == 0xd800) {
          if ((UVar8 & 0xfc00U) != 0xdc00) goto LAB_00101c8f;
          uVar4 = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)UVar8 + 0xfca02400;
        }
        bVar10 = true;
      }
      if (bVar10) {
        if (uVar4 < 0x110000) {
          if (uVar4 < 0x80) {
            in_R9B = 0;
            in_R8D = uVar4;
          }
          else {
            bVar3 = (byte)uVar4;
            if (uVar4 < 0x800) {
              in_R8D = (uint)(byte)((byte)(uVar4 >> 6) | 0xc0);
              in_R9B = bVar3 & 0x3f | 0x80;
              in_R11B = 0;
            }
            else if (uVar4 < 0x10000) {
              in_R8D = (uint)(byte)((byte)(uVar4 >> 0xc) | 0xe0);
              in_R9B = (byte)(uVar4 >> 6) & 0x3f | 0x80;
              in_R11B = bVar3 & 0x3f | 0x80;
              in_R10B = 0;
            }
            else {
              in_R8D = (uint)(byte)((byte)(uVar4 >> 0x12) | 0xf0);
              in_R9B = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
              in_R11B = (byte)(uVar4 >> 6) & 0x3f | 0x80;
              in_R10B = bVar3 & 0x3f | 0x80;
            }
          }
        }
        else {
          in_R8D = 0;
        }
      }
      UVar5 = UTF_INSUFFICIENT_BUFFER;
      if (pUVar7 == pUVar6) goto LAB_00101db8;
      uj8 = pUVar7 + 1;
      *pUVar7 = (UTF_UC8)in_R8D;
      if (in_R9B != 0) {
        if (uj8 == pUVar6) goto LAB_00101dbb;
        uj8 = pUVar7 + 2;
        pUVar7[1] = in_R9B;
        if (in_R11B != 0) {
          if (uj8 == pUVar6) goto LAB_00101dbb;
          uj8 = pUVar7 + 3;
          pUVar7[2] = in_R11B;
          if (in_R10B != 0) {
            if (uj8 == pUVar6) goto LAB_00101dbb;
            pUVar7[3] = in_R10B;
            uj8 = pUVar7 + 4;
          }
        }
      }
      uj16 = uj16 + 1;
      pUVar7 = uj8;
    } while (uj16 != pUVar1);
  }
  UVar5 = UTF_SUCCESS;
LAB_00101dbb:
  *uj8 = '\0';
  return UVar5;
}

Assistant:

static __inline UTF_RET
UTF_uj16_to_uj8(const UTF_UC16 *uj16, UTF_SIZE_T uj16size, UTF_UC8 *uj8, UTF_SIZE_T uj8size)
{
    UTF_UC16 uc16[2];
    UTF_UC8 uc8[4];
    const UTF_UC16 *uj16end = uj16 + uj16size;
    UTF_UC8 *uj8end = uj8 + uj8size - 1;

    if (!uj8size && uj16size)
        return UTF_INSUFFICIENT_BUFFER;

    for (; uj16 != uj16end; ++uj16)
    {
        if (UTF_uc16_is_surrogate_high(*uj16))
        {
            uc16[0] = *uj16;
            if (++uj16 == uj16end)
            {
                if (!UTF_DEFAULT_CHAR)
                {
                    *uj8 = 0;
                    return UTF_INVALID;
                }
                if (uj8 == uj8end)
                {
                    *uj8 = 0;
                    return UTF_INSUFFICIENT_BUFFER;
                }
                *uj8++ = UTF_STATIC_CAST(UTF_UC8, UTF_DEFAULT_CHAR);
                *uj8 = 0;
                return UTF_SUCCESS;
            }
            uc16[1] = *uj16;
        }
        else
        {
            uc16[0] = *uj16;
            uc16[1] = 0;
        }

        if (!UTF_uc16_to_uc8(uc16, uc8))
        {
            if (!UTF_DEFAULT_CHAR)
            {
                *uj8 = 0;
                return UTF_INVALID;
            }
            uc16[0] = UTF_DEFAULT_CHAR;
            uc16[1] = 0;
        }

        if (uj8 == uj8end)
        {
            *uj8 = 0;
            return UTF_INSUFFICIENT_BUFFER;
        }

        *uj8++ = uc8[0];
        if (uc8[1])
        {
            if (uj8 == uj8end)
            {
                *uj8 = 0;
                return UTF_INSUFFICIENT_BUFFER;
            }
            *uj8++ = uc8[1];
            if (uc8[2])
            {
                if (uj8 == uj8end)
                {
                    *uj8 = 0;
                    return UTF_INSUFFICIENT_BUFFER;
                }
                *uj8++ = uc8[2];
                if (uc8[3])
                {
                    if (uj8 == uj8end)
                    {
                        *uj8 = 0;
                        return UTF_INSUFFICIENT_BUFFER;
                    }
                    *uj8++ = uc8[3];
                }
            }
        }
    }
    *uj8 = 0;
    return UTF_SUCCESS;
}